

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

aiNode * __thiscall
anon_unknown.dwarf_d401fb::ProcessSpatialStructure
          (anon_unknown_dwarf_d401fb *this,aiNode *parent,IfcProduct *el,ConversionData *conv,
          vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
          *collect_openings)

{
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_00;
  undefined8 *puVar1;
  long *plVar2;
  pointer pLVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  iterator iVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [8];
  aiScene *paVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  pointer ppIVar35;
  pointer ppIVar36;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar37;
  pointer __p_1;
  long lVar38;
  aiNode *this_01;
  long *plVar39;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var40;
  aiNode *paVar41;
  aiString *paVar42;
  aiMetadataEntry *__s;
  undefined4 *puVar43;
  _Rb_tree_node_base *p_Var44;
  IfcObjectPlacement *place;
  _Base_ptr p_Var45;
  LazyObject *this_02;
  Object *pOVar46;
  long lVar47;
  IfcSpatialStructureElement *pIVar48;
  IfcElement *pIVar49;
  aiMatrix4x4t<double> *paVar50;
  aiMatrix4x4t<float> *this_03;
  IfcObjectDefinition *pIVar51;
  aiNode **ppaVar52;
  aiNode *paVar53;
  IfcProductRepresentation *pIVar54;
  IFC *pIVar55;
  IfcCartesianTransformationOperator *op_00;
  IfcRepresentationMap *pIVar56;
  IfcRepresentation *pIVar57;
  undefined7 extraout_var;
  undefined8 uVar58;
  undefined8 extraout_RAX;
  aiNode **__s_00;
  _Base_ptr p_Var59;
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [16];
  aiMaterial **ppaVar62;
  size_type *psVar63;
  _Base_ptr p_Var64;
  _Base_ptr p_Var65;
  uint uVar66;
  iterator __begin3;
  aiString *paVar67;
  undefined8 *puVar68;
  TempOpening *pTVar69;
  TempOpening *op;
  size_t __n;
  TempOpening *pTVar70;
  double *pdVar71;
  const_iterator __position;
  const_iterator it;
  ulong uVar72;
  ulong __n_00;
  char *pcVar73;
  pointer pLVar74;
  bool bVar75;
  byte bVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar93;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes_1;
  Metadata properties;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  aiNode *ndnew;
  aiNode **local_7d8;
  iterator iStack_7d0;
  aiNode **local_7c8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_7b8;
  undefined4 local_7b0;
  allocator local_7a9;
  aiNode *local_7a8;
  char acStack_7a0 [4];
  char acStack_79c [4];
  aiNode *local_798;
  _Rb_tree_node_base *local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined8 local_768;
  undefined8 uStack_760;
  aiMatrix4x4 *local_750;
  undefined1 local_748 [24];
  _Base_ptr p_Stack_730;
  _Base_ptr local_728;
  size_t local_720;
  _Rb_tree_node_base *local_718;
  double dStack_710;
  undefined1 local_708 [16];
  _Base_ptr p_Stack_6f8;
  _Rb_tree_node_base *p_Stack_6f0;
  _Rb_tree_node_base *p_Stack_6e8;
  double local_6e0;
  pointer ppaStack_6d8;
  pointer ppaStack_6d0;
  double dStack_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double dStack_6a8;
  double dStack_6a0;
  double dStack_698;
  double local_690;
  undefined1 local_688 [16];
  undefined1 auStack_678 [16];
  undefined1 auStack_668 [8];
  aiScene *local_660;
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 auStack_628 [16];
  undefined1 auStack_618 [8];
  double local_610;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *local_600;
  double local_5f8;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  local_5f0;
  undefined1 local_5d8 [16];
  pointer local_5c8;
  pointer ppaStack_5c0;
  aiMaterial **local_5b8;
  pointer local_5b0;
  aiMaterial *local_5a8;
  long lStack_5a0;
  aiNode *local_598;
  _Base_ptr p_Stack_590;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_588;
  _Rb_tree_node_base *local_568;
  ConversionData *local_560;
  undefined8 local_558;
  size_t sStack_550;
  undefined8 local_548;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvStack_540;
  undefined8 local_538;
  undefined1 auStack_530 [8];
  double local_528;
  _Base_ptr p_Stack_520;
  _Base_ptr local_518;
  _Base_ptr p_Stack_510;
  aiNode *local_508;
  _Base_ptr p_Stack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *p_Stack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_4b8;
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  _Rb_tree_color local_468;
  undefined4 uStack_464;
  _Rb_tree_color _Stack_460;
  undefined4 uStack_45c;
  char local_458 [4];
  char acStack_454 [4];
  char acStack_450 [4];
  char acStack_44c [4];
  char local_448 [4];
  char acStack_444 [4];
  char acStack_440 [4];
  char acStack_43c [4];
  undefined1 local_438 [24];
  double dStack_420;
  undefined1 auStack_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 auStack_3d8 [16];
  undefined1 auStack_3c8 [920];
  
  dStack_420 = (double)local_438._16_8_;
  auStack_678._8_8_ = auStack_678._0_8_;
  bVar76 = 0;
  lVar47 = *(long *)&(el->super_IfcObject).field_0x18;
  pcVar73 = *(char **)&el[1].super_IfcObject.field_0x28;
  if ((*pcVar73 == '\x01') &&
     (lVar38 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcSpace::typeinfo,0xffffffffffffffff),
     lVar38 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4a886c);
    pcVar73 = *(char **)&el[1].super_IfcObject.field_0x28;
    local_7b0 = (undefined4)CONCAT71((int7)((ulong)el >> 8),1);
  }
  else {
    local_7b0 = 0;
  }
  if ((pcVar73[2] == '\x01') &&
     (lVar38 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcAnnotation::typeinfo,0xffffffffffffffff),
     lVar38 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4a88c9);
    return (aiNode *)0x0;
  }
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  std::__cxx11::string::string
            ((string *)&local_4b8,
             *(char **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 0xc),
             (allocator *)&local_788);
  plVar39 = (long *)std::__cxx11::string::append((char *)&local_4b8);
  local_748._0_8_ = local_748 + 0x10;
  paVar41 = (aiNode *)(plVar39 + 2);
  if ((aiNode *)*plVar39 == paVar41) {
    local_748._16_8_ = *(undefined8 *)&paVar41->mName;
    p_Stack_730 = (_Base_ptr)plVar39[3];
  }
  else {
    local_748._16_8_ = *(undefined8 *)&paVar41->mName;
    local_748._0_8_ = (aiNode *)*plVar39;
  }
  local_748._8_8_ = plVar39[1];
  *plVar39 = (long)paVar41;
  plVar39[1] = 0;
  *(undefined1 *)(plVar39 + 2) = 0;
  if ((parent->mName).data[0x54] == '\x01') {
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    lVar38 = *(long *)((parent->mName).data + 0x34);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_788,lVar38,*(long *)((parent->mName).data + 0x3c) + lVar38);
  }
  else {
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"Unnamed","");
  }
  plVar39 = (long *)std::__cxx11::string::_M_append(local_748,(ulong)local_788._M_dataplus._M_p);
  local_688._0_8_ = auStack_678;
  pauVar60 = (undefined1 (*) [16])(plVar39 + 2);
  if ((undefined1 (*) [16])*plVar39 == pauVar60) {
    auStack_678 = *pauVar60;
  }
  else {
    auStack_678._0_8_ = *(long *)*pauVar60;
    local_688._0_8_ = (undefined1 (*) [16])*plVar39;
  }
  local_688._8_8_ = plVar39[1];
  *plVar39 = (long)pauVar60;
  plVar39[1] = 0;
  *(undefined1 *)(plVar39 + 2) = 0;
  plVar39 = (long *)std::__cxx11::string::append(local_688);
  paVar41 = (aiNode *)(plVar39 + 2);
  if ((aiNode *)*plVar39 == paVar41) {
    p_Stack_6f8 = *(_Base_ptr *)&paVar41->mName;
    p_Stack_6f0 = (_Rb_tree_node_base *)plVar39[3];
    local_708._0_8_ = (aiNode *)&p_Stack_6f8;
  }
  else {
    p_Stack_6f8 = *(_Base_ptr *)&paVar41->mName;
    local_708._0_8_ = (aiNode *)*plVar39;
  }
  local_708._8_8_ = plVar39[1];
  *plVar39 = (long)paVar41;
  plVar39[1] = 0;
  *(undefined1 *)(plVar39 + 2) = 0;
  local_560 = conv;
  plVar39 = (long *)std::__cxx11::string::_M_append
                              (local_708,*(ulong *)((parent->mName).data + 0xc));
  pauVar60 = (undefined1 (*) [16])(local_438 + 0x10);
  pauVar61 = (undefined1 (*) [16])(plVar39 + 2);
  if ((undefined1 (*) [16])*plVar39 == pauVar61) {
    unique0x10004676 = *pauVar61;
  }
  else {
    local_438._16_8_ = *(long *)*pauVar61;
    pauVar60 = (undefined1 (*) [16])*plVar39;
  }
  uVar72 = plVar39[1];
  local_438._8_8_ = uVar72;
  local_438._0_8_ = pauVar60;
  *plVar39 = (long)pauVar61;
  plVar39[1] = 0;
  *(undefined1 *)(plVar39 + 2) = 0;
  if (uVar72 < 0x400) {
    (this_01->mName).length = (ai_uint32)uVar72;
    memcpy((this_01->mName).data,pauVar60,uVar72);
    (this_01->mName).data[uVar72] = '\0';
  }
  if (pauVar60 != (undefined1 (*) [16])(local_438 + 0x10)) {
    operator_delete(pauVar60);
  }
  if ((aiNode *)local_708._0_8_ != (aiNode *)&p_Stack_6f8) {
    operator_delete((void *)local_708._0_8_);
  }
  if ((pointer)local_688._0_8_ != (pointer)auStack_678) {
    operator_delete((void *)local_688._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if ((aiNode *)local_748._0_8_ != (aiNode *)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  this_00 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)(lVar47 + 0xc0);
  if ((_Base_ptr *)local_4b8._M_impl._0_8_ !=
      &local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_4b8._M_impl._0_8_);
  }
  this_01->mParent = (aiNode *)this;
  local_600 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               *)&el[1].super_IfcObject.field_0x40;
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>
            ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              *)local_600,(unsigned_long *)local_438);
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  local_768 = this_00;
  pVar93 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(this_00,(key_type_conflict1 *)local_438);
  _Var40 = pVar93.first._M_node;
  if (_Var40._M_node != (_Rb_tree_node_base *)(lVar47 + 200)) {
    p_Stack_6f0 = (_Rb_tree_node_base *)(local_708 + 8);
    local_708._8_8_ = local_708._8_8_ & 0xffffffff00000000;
    p_Stack_6f8 = (_Base_ptr)0x0;
    local_6e0 = 0.0;
    p_Stack_6e8 = p_Stack_6f0;
    if (_Var40._M_node == pVar93.second._M_node._M_node) {
      ProcessMetadata((uint64_t)_Var40._M_node[1]._M_parent,(ConversionData *)el,
                      (Metadata *)local_708);
    }
    else {
      do {
        ProcessMetadata((uint64_t)_Var40._M_node[1]._M_parent,(ConversionData *)el,
                        (Metadata *)local_708);
        _Var40._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var40._M_node);
      } while (_Var40._M_node != pVar93.second._M_node._M_node);
    }
    dVar4 = local_6e0;
    if (local_6e0 != 0.0) {
      uVar66 = SUB84(local_6e0,0);
      if (uVar66 == 0) {
        local_7a8 = (aiNode *)0x0;
      }
      else {
        paVar41 = (aiNode *)operator_new(0x18);
        (paVar41->mName).length = uVar66;
        uVar72 = (ulong)dVar4 & 0xffffffff;
        paVar42 = (aiString *)operator_new__(uVar72 * 0x404);
        paVar67 = paVar42;
        local_7a8 = paVar41;
        do {
          paVar67->length = 0;
          paVar67->data[0] = '\0';
          memset(paVar67->data + 1,0x1b,0x3ff);
          paVar41 = local_7a8;
          paVar67 = paVar67 + 1;
        } while (paVar67 != paVar42 + uVar72);
        *(aiString **)((local_7a8->mName).data + 4) = paVar42;
        __s = (aiMetadataEntry *)operator_new__(uVar72 << 4);
        memset(__s,0,uVar72 << 4);
        *(aiMetadataEntry **)((paVar41->mName).data + 0xc) = __s;
      }
      if (p_Stack_6f0 != (_Rb_tree_node_base *)(local_708 + 8)) {
        uVar66 = 0;
        p_Var44 = p_Stack_6f0;
        do {
          __n = (ulong)p_Var44[2]._M_parent & 0xffffffff;
          if (((ulong)p_Var44[2]._M_parent & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          local_438._0_4_ = (uint)__n;
          memcpy(local_438 + 4,*(void **)(p_Var44 + 2),__n);
          local_438[__n + 4] = 0;
          if ((uVar66 < (local_7a8->mName).length) &&
             (p_Var59 = p_Var44[1]._M_parent, p_Var59 != (_Base_ptr)0x0)) {
            if (p_Var59 < (_Base_ptr)&DAT_00000400) {
              paVar42 = *(aiString **)((local_7a8->mName).data + 4);
              paVar67 = paVar42 + uVar66;
              paVar67->length = (ai_uint32)p_Var59;
              memcpy(paVar67->data,*(void **)(p_Var44 + 1),(size_t)p_Var59);
              (&p_Var59->field_0x4)[(long)(paVar42 + uVar66)] = 0;
            }
            paVar41 = local_7a8;
            (*(aiMetadataEntry **)((local_7a8->mName).data + 0xc))[uVar66].mType = AI_AISTRING;
            puVar43 = (undefined4 *)operator_new(0x404);
            if (0x3fe < (uint)__n) {
              __n = 0x3ff;
            }
            *puVar43 = (int)__n;
            memcpy(puVar43 + 1,local_438 + 4,__n);
            *(undefined1 *)((long)puVar43 + __n + 4) = 0;
            (*(aiMetadataEntry **)((paVar41->mName).data + 0xc))[uVar66].mData = puVar43;
          }
          uVar66 = uVar66 + 1;
          p_Var44 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var44);
        } while (p_Var44 != (_Rb_tree_node_base *)(local_708 + 8));
      }
      this_01->mMetaData = (aiMetadata *)local_7a8;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_708);
  }
  if ((parent->mName).data[0xe4] == '\x01') {
    place = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                      (*(LazyObject **)((parent->mName).data + 0xdc));
    ResolveObjectPlacement(&this_01->mTransformation,place,(ConversionData *)el);
  }
  local_588.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8 = 0.0;
  dStack_4d0 = 0.0;
  local_4c8 = 0.0;
  dStack_4c0 = 0.0;
  local_4f8 = 0.0;
  dStack_4f0 = 0.0;
  local_4e8 = 0.0;
  p_Stack_4e0 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)0x0;
  local_518 = (_Base_ptr)0x0;
  p_Stack_510 = (_Base_ptr)0x0;
  local_508 = (aiNode *)0x0;
  p_Stack_500 = (_Base_ptr)0x0;
  local_7c8 = (aiNode **)0x0;
  local_7d8 = (aiNode **)0x0;
  iStack_7d0._M_current = (aiNode **)0x0;
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  pVar93 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(local_768,(key_type_conflict1 *)local_438);
  if (pVar93.first._M_node._M_node != pVar93.second._M_node._M_node) {
    local_790 = (_Rb_tree_node_base *)&el[1].super_IfcObject.field_0x48;
    local_750 = &this_01->mTransformation;
    local_5f8 = 0.0;
    local_558 = (_Base_ptr)0x3ff0000000000000;
    sStack_550 = 0;
    local_538 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                0x3ff0000000000000;
    auStack_530 = (undefined1  [8])0x0;
    local_528 = 1.0;
    p_Stack_520 = (_Base_ptr)0x0;
    local_548 = (aiNode *)0x3ff0000000000000;
    pvStack_540 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0
    ;
    local_568 = pVar93.first._M_node._M_node;
    do {
      local_7b8 = pVar93.second._M_node;
      p_Var45 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
      p_Var59 = pVar93.first._M_node._M_node[1]._M_parent;
      p_Var44 = local_790;
      if (p_Var45 == (_Rb_tree_node_base *)0x0) {
LAB_004a9028:
        this_02 = Assimp::STEP::DB::MustGetObject
                            (*(DB **)&(el->super_IfcObject).field_0x18,(uint64_t)p_Var59);
        pOVar46 = Assimp::STEP::LazyObject::operator*(this_02);
        lVar47 = __dynamic_cast(pOVar46,&Assimp::STEP::Object::typeinfo,
                                &Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::
                                 typeinfo,0xffffffffffffffff);
        if (lVar47 == 0) {
          pOVar46 = Assimp::STEP::LazyObject::operator*(this_02);
          lVar47 = __dynamic_cast(pOVar46,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelVoidsElement::typeinfo,
                                  0xffffffffffffffff);
          if ((lVar47 != 0) &&
             (pIVar49 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcElement>
                                  (*(LazyObject **)(lVar47 + 0xb8)),
             *(long *)(&(pIVar49->super_IfcProduct).super_IfcObject.field_0x8 +
                      *(long *)(*(long *)&(pIVar49->super_IfcProduct).super_IfcObject + -0x18)) ==
             *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
            paVar53 = (aiNode *)
                      Assimp::STEP::LazyObject::
                      To<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>
                                (*(LazyObject **)(lVar47 + 0xc0));
            paVar41 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar41);
            (paVar41->mName).length = 0x10;
            builtin_strncpy((paVar41->mName).data,"$RelVoidsElement",0x11);
            paVar41->mParent = this_01;
            fVar5 = local_750->a2;
            fVar6 = local_750->a3;
            fVar7 = local_750->a4;
            fVar8 = local_750->b1;
            fVar9 = local_750->b2;
            fVar10 = local_750->b3;
            fVar11 = local_750->b4;
            fVar12 = local_750->c1;
            fVar13 = local_750->c2;
            fVar14 = local_750->c3;
            fVar15 = local_750->c4;
            fVar16 = local_750->d1;
            fVar17 = local_750->d2;
            fVar18 = local_750->d3;
            fVar19 = local_750->d4;
            (paVar41->mTransformation).a1 = local_750->a1;
            (paVar41->mTransformation).a2 = fVar5;
            (paVar41->mTransformation).a3 = fVar6;
            (paVar41->mTransformation).a4 = fVar7;
            (paVar41->mTransformation).b1 = fVar8;
            (paVar41->mTransformation).b2 = fVar9;
            (paVar41->mTransformation).b3 = fVar10;
            (paVar41->mTransformation).b4 = fVar11;
            (paVar41->mTransformation).c1 = fVar12;
            (paVar41->mTransformation).c2 = fVar13;
            (paVar41->mTransformation).c3 = fVar14;
            (paVar41->mTransformation).c4 = fVar15;
            (paVar41->mTransformation).d1 = fVar16;
            (paVar41->mTransformation).d2 = fVar17;
            (paVar41->mTransformation).d3 = fVar18;
            (paVar41->mTransformation).d4 = fVar19;
            local_688 = ZEXT816(0);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = auStack_678._8_8_;
            auStack_678 = auVar21 << 0x40;
            local_748._0_8_ = paVar41;
            paVar53 = ProcessSpatialStructure
                                ((anon_unknown_dwarf_d401fb *)paVar41,paVar53,el,
                                 (ConversionData *)local_688,collect_openings);
            if (paVar53 == (aiNode *)0x0) {
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )local_688);
              aiNode::~aiNode(paVar41);
              operator_delete(paVar41);
            }
            else {
              paVar41->mNumChildren = 1;
              paVar50 = (aiMatrix4x4t<double> *)operator_new__(8);
              paVar41->mChildren = (aiNode **)paVar50;
              paVar50->a1 = (double)paVar53;
              if (local_688._8_8_ != local_688._0_8_) {
                pTVar69 = (TempOpening *)local_688._8_8_;
                pTVar70 = (TempOpening *)local_688._0_8_;
                if (((ulong)local_5f8 & 1) == 0) {
                  local_708._0_8_ = *(undefined8 *)local_750;
                  local_708._8_8_ = *(undefined8 *)&local_750->a3;
                  p_Stack_6f8 = *(_Base_ptr *)&local_750->b1;
                  p_Stack_6f0 = *(_Rb_tree_node_base **)&local_750->b3;
                  p_Stack_6e8 = *(_Rb_tree_node_base **)&local_750->c1;
                  local_6e0 = *(double *)&local_750->c3;
                  ppaStack_6d8 = *(pointer *)&local_750->d1;
                  ppaStack_6d0 = *(pointer *)&local_750->d3;
                  this_03 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_708);
                  paVar50 = aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(this_03);
                  local_548 = (aiNode *)local_438._0_8_;
                  pvStack_540 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 *)0x0;
                  local_538 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                               *)auStack_418._8_8_;
                  auStack_530 = (undefined1  [8])0x0;
                  local_4c8 = dStack_420;
                  dStack_4c0 = (double)auStack_418._0_8_;
                  local_4d8 = (double)local_438._8_8_;
                  dStack_4d0 = (double)local_438._16_8_;
                  local_4f8 = (double)local_408._0_8_;
                  dStack_4f0 = (double)local_408._8_8_;
                  local_4e8 = (double)local_3f8._0_8_;
                  p_Stack_4e0 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                 *)local_3f8._8_8_;
                  local_558 = (_Base_ptr)local_3e8._0_8_;
                  sStack_550 = 0;
                  local_518 = (_Base_ptr)local_3e8._8_8_;
                  p_Stack_510 = (_Base_ptr)auStack_3d8._0_8_;
                  local_508 = (aiNode *)auStack_3d8._8_8_;
                  p_Stack_500 = (_Base_ptr)auStack_3c8._0_8_;
                  local_528 = (double)auStack_3c8._8_8_;
                  p_Stack_520 = (_Base_ptr)0x0;
                  pTVar69 = (TempOpening *)local_688._8_8_;
                  pTVar70 = (TempOpening *)local_688._0_8_;
                }
                pvVar37 = local_538;
                paVar53 = local_548;
                p_Var59 = local_558;
                local_5f8 = (double)CONCAT71((int7)((ulong)paVar50 >> 8),1);
                if (pTVar70 != pTVar69) {
                  local_7a8 = local_548;
                  acStack_7a0[0] = (char)local_548;
                  acStack_7a0[1] = local_548._1_1_;
                  acStack_7a0[2] = local_548._2_1_;
                  acStack_7a0[3] = local_548._3_1_;
                  acStack_79c[0] = local_548._4_1_;
                  acStack_79c[1] = local_548._5_1_;
                  acStack_79c[2] = local_548._6_1_;
                  acStack_79c[3] = local_548._7_1_;
                  local_448[0] = (char)local_538;
                  local_448[1] = local_538._1_1_;
                  local_448[2] = local_538._2_1_;
                  local_448[3] = local_538._3_1_;
                  acStack_444[0] = local_538._4_1_;
                  acStack_444[1] = local_538._5_1_;
                  acStack_444[2] = local_538._6_1_;
                  acStack_444[3] = local_538._7_1_;
                  acStack_440[0] = (char)local_538;
                  acStack_440[1] = local_538._1_1_;
                  acStack_440[2] = local_538._2_1_;
                  acStack_440[3] = local_538._3_1_;
                  acStack_43c[0] = local_538._4_1_;
                  acStack_43c[1] = local_538._5_1_;
                  acStack_43c[2] = local_538._6_1_;
                  acStack_43c[3] = local_538._7_1_;
                  local_458[0] = (char)local_558;
                  local_458[1] = local_558._1_1_;
                  local_458[2] = local_558._2_1_;
                  local_458[3] = local_558._3_1_;
                  acStack_454[0] = local_558._4_1_;
                  acStack_454[1] = local_558._5_1_;
                  acStack_454[2] = local_558._6_1_;
                  acStack_454[3] = local_558._7_1_;
                  acStack_450[0] = (char)local_558;
                  acStack_450[1] = local_558._1_1_;
                  acStack_450[2] = local_558._2_1_;
                  acStack_450[3] = local_558._3_1_;
                  acStack_44c[0] = local_558._4_1_;
                  acStack_44c[1] = local_558._5_1_;
                  acStack_44c[2] = local_558._6_1_;
                  acStack_44c[3] = local_558._7_1_;
                  local_468 = local_528._0_4_;
                  uStack_464 = local_528._4_4_;
                  _Stack_460 = local_528._0_4_;
                  uStack_45c = local_528._4_4_;
                  local_558 = p_Var59;
                  local_548 = paVar53;
                  local_538 = pvVar37;
                  do {
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                              (&(**(aiNode ***)(local_748._0_8_ + 0x458))->mTransformation);
                    local_768 = p_Stack_4e0;
                    uStack_760 = (double)local_3e8._0_8_;
                    local_718 = p_Stack_6e8;
                    dStack_710 = local_6e0;
                    dVar4 = dStack_6a0 * local_4c8 +
                            dStack_6c0 * dStack_4d0 +
                            (double)local_708._8_8_ * (double)CONCAT44(acStack_79c,acStack_7a0) +
                            local_4d8 * local_6e0;
                    local_598 = local_508;
                    p_Stack_590 = p_Stack_500;
                    local_438._8_4_ = SUB84(dVar4,0);
                    local_438._0_8_ =
                         dStack_6a8 * local_4c8 +
                         dStack_6c8 * dStack_4d0 +
                         (double)local_708._0_8_ * (double)local_7a8 +
                         local_4d8 * (double)p_Stack_6e8;
                    local_438._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    local_5c8 = ppaStack_6d8;
                    ppaStack_5c0 = ppaStack_6d0;
                    local_5d8._8_4_ = SUB84((double)p_Stack_510 * (double)p_Stack_6f0,0);
                    local_5d8._0_8_ = (double)p_Stack_510 * (double)p_Stack_6f8;
                    local_5d8._12_4_ =
                         (int)((ulong)((double)p_Stack_510 * (double)p_Stack_6f0) >> 0x20);
                    dVar4 = local_4c8 * local_690 +
                            dStack_4d0 * dStack_6b0 +
                            (double)p_Stack_6f0 * (double)CONCAT44(acStack_79c,acStack_7a0) +
                            local_4d8 * (double)ppaStack_6d0;
                    unique0x10002abf = SUB84(dVar4,0);
                    local_438._16_8_ =
                         local_4c8 * dStack_698 +
                         dStack_4d0 * local_6b8 +
                         (double)p_Stack_6f8 * (double)local_7a8 + local_4d8 * (double)ppaStack_6d8;
                    unique0x10002ac3 = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = dStack_6a0 * dStack_4f0 +
                            dStack_6c0 * local_4f8 +
                            (double)local_708._8_8_ * dStack_4c0 +
                            (double)CONCAT44(acStack_43c,acStack_440) * local_6e0;
                    auStack_418._8_4_ = SUB84(dVar4,0);
                    auStack_418._0_8_ =
                         dStack_6a8 * dStack_4f0 +
                         dStack_6c8 * local_4f8 +
                         (double)local_708._0_8_ * dStack_4c0 +
                         (double)CONCAT44(acStack_444,local_448) * (double)p_Stack_6e8;
                    auStack_418._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = dStack_4f0 * local_690 +
                            local_4f8 * dStack_6b0 +
                            dStack_4c0 * (double)p_Stack_6f0 +
                            (double)CONCAT44(acStack_43c,acStack_440) * (double)ppaStack_6d0;
                    local_408._8_4_ = SUB84(dVar4,0);
                    local_408._0_8_ =
                         dStack_4f0 * dStack_698 +
                         local_4f8 * local_6b8 +
                         dStack_4c0 * (double)p_Stack_6f8 +
                         (double)CONCAT44(acStack_444,local_448) * (double)ppaStack_6d8;
                    local_408._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = dStack_6a0 * (double)local_518 +
                            dStack_6c0 * (double)CONCAT44(acStack_44c,acStack_450) +
                            (double)local_708._8_8_ * local_4e8 + local_6e0 * (double)p_Stack_4e0;
                    local_3f8._8_4_ = SUB84(dVar4,0);
                    local_3f8._0_8_ =
                         dStack_6a8 * (double)local_518 +
                         dStack_6c8 * (double)CONCAT44(acStack_454,local_458) +
                         (double)local_708._0_8_ * local_4e8 +
                         (double)p_Stack_6e8 * (double)p_Stack_4e0;
                    local_3f8._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = (double)local_518 * local_690 +
                            dStack_6b0 * (double)CONCAT44(acStack_44c,acStack_450) +
                            local_4e8 * (double)p_Stack_6f0 +
                            (double)p_Stack_4e0 * (double)ppaStack_6d0;
                    local_3e8._8_4_ = SUB84(dVar4,0);
                    local_3e8._0_8_ =
                         (double)local_518 * dStack_698 +
                         local_6b8 * (double)CONCAT44(acStack_454,local_458) +
                         local_4e8 * (double)p_Stack_6f8 +
                         (double)p_Stack_4e0 * (double)ppaStack_6d8;
                    local_3e8._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = dStack_6a0 * (double)CONCAT44(uStack_45c,_Stack_460) +
                            dStack_6c0 * (double)p_Stack_500 +
                            (double)local_708._8_8_ * (double)p_Stack_510 +
                            local_6e0 * (double)local_508;
                    auStack_3d8._8_4_ = SUB84(dVar4,0);
                    auStack_3d8._0_8_ =
                         dStack_6a8 * (double)CONCAT44(uStack_464,local_468) +
                         dStack_6c8 * (double)p_Stack_500 +
                         (double)local_708._0_8_ * (double)p_Stack_510 +
                         (double)p_Stack_6e8 * (double)local_508;
                    auStack_3d8._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    dVar4 = local_690 * (double)CONCAT44(uStack_45c,_Stack_460) +
                            (double)p_Stack_500 * dStack_6b0 +
                            (double)local_5d8._8_8_ + (double)local_508 * (double)ppaStack_6d0;
                    auStack_3c8._8_4_ = SUB84(dVar4,0);
                    auStack_3c8._0_8_ =
                         dStack_698 * (double)CONCAT44(uStack_464,local_468) +
                         (double)p_Stack_500 * local_6b8 +
                         (double)p_Stack_510 * (double)p_Stack_6f8 +
                         (double)local_508 * (double)ppaStack_6d8;
                    auStack_3c8._12_4_ = (int)((ulong)dVar4 >> 0x20);
                    Assimp::IFC::TempOpening::Transform(pTVar70,(IfcMatrix4 *)local_438);
                    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                    ::push_back(&local_588,pTVar70);
                    pTVar70 = pTVar70 + 1;
                    paVar41 = (aiNode *)local_748._0_8_;
                  } while (pTVar70 != pTVar69);
                }
              }
              local_748._0_8_ = (aiNode *)0x0;
              local_438._0_8_ = paVar41;
              if (iStack_7d0._M_current == local_7c8) {
                std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_7d8,iStack_7d0,
                           (aiNode **)local_438);
              }
              else {
                *iStack_7d0._M_current = paVar41;
                iStack_7d0._M_current = iStack_7d0._M_current + 1;
              }
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )local_688);
            }
          }
        }
        else {
          pIVar48 = Assimp::STEP::LazyObject::
                    To<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                              (*(LazyObject **)(lVar47 + 0xd0));
          if (*(long *)(&(pIVar48->super_IfcProduct).super_IfcObject.field_0x8 +
                       *(long *)(*(long *)&(pIVar48->super_IfcProduct).super_IfcObject + -0x18)) ==
              *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4)) {
            puVar1 = *(undefined8 **)(lVar47 + 0xc0);
            for (puVar68 = *(undefined8 **)(lVar47 + 0xb8); puVar68 != puVar1; puVar68 = puVar68 + 1
                ) {
              paVar41 = (aiNode *)
                        Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProduct>
                                  ((LazyObject *)*puVar68);
              lVar47 = __dynamic_cast((paVar41->mName).data +
                                      *(long *)(*(long *)&paVar41->mName + -0x18) + -4,
                                      &Assimp::STEP::Object::typeinfo,
                                      &Assimp::IFC::Schema_2x3::IfcOpeningElement::typeinfo);
              if (lVar47 == 0) {
                paVar41 = ProcessSpatialStructure
                                    ((anon_unknown_dwarf_d401fb *)this_01,paVar41,el,
                                     (ConversionData *)0x0,collect_openings);
                local_438._0_8_ = paVar41;
                if (paVar41 != (aiNode *)0x0) {
                  if (iStack_7d0._M_current == local_7c8) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_7d8,iStack_7d0,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_7d0._M_current = paVar41;
                    iStack_7d0._M_current = iStack_7d0._M_current + 1;
                  }
                }
              }
            }
          }
        }
      }
      else {
        do {
          if (*(_Base_ptr *)(p_Var45 + 1) >= p_Var59) {
            p_Var44 = p_Var45;
          }
          p_Var45 = (&p_Var45->_M_left)[*(_Base_ptr *)(p_Var45 + 1) < p_Var59];
        } while (p_Var45 != (_Base_ptr)0x0);
        if ((p_Var44 == local_790) || (p_Var59 < *(_Base_ptr *)(p_Var44 + 1))) goto LAB_004a9028;
      }
      _Var40._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar93.first._M_node._M_node);
      pVar93.second._M_node = local_7b8._M_node;
      pVar93.first._M_node = _Var40._M_node;
    } while (_Var40._M_node != local_7b8._M_node);
    if (local_568 != local_7b8._M_node) {
      local_7a8 = (aiNode *)&el[1].super_IfcObject.field_0x48;
      p_Var44 = local_568;
      _Var40._M_node = local_7b8._M_node;
      do {
        paVar41 = *(aiNode **)&el[1].super_IfcObject.field_0x50;
        p_Var59 = p_Var44[1]._M_parent;
        paVar53 = local_7a8;
        if (paVar41 == (aiNode *)0x0) {
LAB_004a989b:
          lVar47 = *(long *)&(el->super_IfcObject).field_0x18;
          lVar38 = *(long *)(lVar47 + 0x70);
          lVar47 = lVar47 + 0x68;
          do {
            bVar75 = *(_Base_ptr *)(lVar38 + 0x20) < p_Var59;
            if (!bVar75) {
              lVar47 = lVar38;
            }
            lVar38 = *(long *)(lVar38 + 0x10 + (ulong)bVar75 * 8);
          } while (lVar38 != 0);
          pOVar46 = Assimp::STEP::LazyObject::operator*(*(LazyObject **)(lVar47 + 0x28));
          lVar47 = __dynamic_cast(pOVar46,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if ((lVar47 != 0) &&
             (pIVar51 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  (*(LazyObject **)(lVar47 + 0xa8)),
             *(long *)((pIVar51->super_IfcRoot).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
                       [-3] + (long)&(pIVar51->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>) ==
             *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
            paVar41 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar41);
            local_438._0_8_ = paVar41;
            (paVar41->mName).length = 0xe;
            builtin_strncpy((paVar41->mName).data,"$RelAggregates",0xf);
            paVar41->mParent = this_01;
            fVar5 = local_750->a2;
            fVar6 = local_750->a3;
            fVar7 = local_750->a4;
            fVar8 = local_750->b1;
            fVar9 = local_750->b2;
            fVar10 = local_750->b3;
            fVar11 = local_750->b4;
            fVar12 = local_750->c1;
            fVar13 = local_750->c2;
            fVar14 = local_750->c3;
            fVar15 = local_750->c4;
            fVar16 = local_750->d1;
            fVar17 = local_750->d2;
            fVar18 = local_750->d3;
            fVar19 = local_750->d4;
            (paVar41->mTransformation).a1 = local_750->a1;
            (paVar41->mTransformation).a2 = fVar5;
            (paVar41->mTransformation).a3 = fVar6;
            (paVar41->mTransformation).a4 = fVar7;
            (paVar41->mTransformation).b1 = fVar8;
            (paVar41->mTransformation).b2 = fVar9;
            (paVar41->mTransformation).b3 = fVar10;
            (paVar41->mTransformation).b4 = fVar11;
            (paVar41->mTransformation).c1 = fVar12;
            (paVar41->mTransformation).c2 = fVar13;
            (paVar41->mTransformation).c3 = fVar14;
            (paVar41->mTransformation).c4 = fVar15;
            (paVar41->mTransformation).d1 = fVar16;
            (paVar41->mTransformation).d2 = fVar17;
            (paVar41->mTransformation).d3 = fVar18;
            (paVar41->mTransformation).d4 = fVar19;
            uVar72 = *(long *)(lVar47 + 0xb8) - *(long *)(lVar47 + 0xb0);
            if ((long)uVar72 < 0) {
              uVar72 = 0xffffffffffffffff;
            }
            ppaVar52 = (aiNode **)operator_new__(uVar72);
            memset(ppaVar52,0,uVar72);
            paVar41->mChildren = ppaVar52;
            puVar1 = *(undefined8 **)(lVar47 + 0xb8);
            for (puVar68 = *(undefined8 **)(lVar47 + 0xb0); puVar68 != puVar1; puVar68 = puVar68 + 1
                ) {
              pIVar51 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar68);
              paVar53 = (aiNode *)
                        __dynamic_cast((_func_int *)
                                       ((long)&(pIVar51->super_IfcRoot).
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                               ._vptr_ObjectHelper +
                                       (long)(pIVar51->super_IfcRoot).
                                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                             ._vptr_ObjectHelper[-3]),
                                       &Assimp::STEP::Object::typeinfo,
                                       &Assimp::IFC::Schema_2x3::IfcProduct::typeinfo);
              if ((paVar53 != (aiNode *)0x0) &&
                 (paVar53 = ProcessSpatialStructure
                                      ((anon_unknown_dwarf_d401fb *)paVar41,paVar53,el,
                                       (ConversionData *)0x0,collect_openings),
                 paVar53 != (aiNode *)0x0)) {
                uVar66 = paVar41->mNumChildren;
                paVar41->mNumChildren = uVar66 + 1;
                paVar41->mChildren[uVar66] = paVar53;
              }
            }
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_438._8_8_;
            local_438._0_16_ = auVar22 << 0x40;
            local_708._0_8_ = paVar41;
            if (iStack_7d0._M_current == local_7c8) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_7d8,iStack_7d0,
                         (aiNode **)local_708);
              _Var40._M_node = local_7b8._M_node;
            }
            else {
              *iStack_7d0._M_current = paVar41;
              iStack_7d0._M_current = iStack_7d0._M_current + 1;
              _Var40._M_node = local_7b8._M_node;
            }
          }
        }
        else {
          do {
            bVar75 = *(_Base_ptr *)((paVar41->mName).data + 0x1c) < p_Var59;
            if (!bVar75) {
              paVar53 = paVar41;
            }
            paVar41 = *(aiNode **)((paVar41->mName).data + (ulong)bVar75 * 8 + 0xc);
          } while (paVar41 != (aiNode *)0x0);
          if ((paVar53 == local_7a8) || (p_Var59 < *(_Base_ptr *)((paVar53->mName).data + 0x1c)))
          goto LAB_004a989b;
        }
        p_Var44 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var44);
      } while (p_Var44 != _Var40._M_node);
    }
  }
  *(ConversionData **)&el[1].super_IfcObject.field_0x38 = local_560;
  if (local_560 == (ConversionData *)0x0) {
    *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
     &el[1].super_IfcObject.field_0x30 = &local_588;
  }
  if ((char)local_7b0 == '\0') {
    if ((parent->mName).data[0xf4] == '\x01') {
      uVar66 = Assimp::IFC::ProcessMaterials
                         (*(uint64_t *)
                           ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4),
                          0xffffffff,(ConversionData *)el,false);
      local_5c8 = (pointer)CONCAT44(local_5c8._4_4_,uVar66);
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_4b8._M_impl.super__Rb_tree_header._M_header;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((parent->mName).data[0xf4] == '\0') {
        __assert_fail("have",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/./code/Step/STEPFile.h"
                      ,0x240,
                      "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>]"
                     );
      }
      pIVar54 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProductRepresentation>
                          (*(LazyObject **)((parent->mName).data + 0xec));
      std::
      vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
      ::vector(&local_5f0,
               (long)(pIVar54->Representations).
                     super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     .
                     super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar54->Representations).
                     super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     .
                     super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_438);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,Assimp::IFC::Schema_2x3::IfcRepresentation_const**>
                ((pIVar54->Representations).
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 .
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pIVar54->Representations).
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 .
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_5f0.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      ppIVar36 = local_5f0.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar35 = local_5f0.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_5f0.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_5f0.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar38 = (long)local_5f0.
                       super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_5f0.
                       super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar72 = lVar38 >> 3;
        lVar47 = 0x3f;
        if (uVar72 != 0) {
          for (; uVar72 >> lVar47 == 0; lVar47 = lVar47 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                  (local_5f0.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_5f0.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar47 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar38 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (ppIVar35,ppIVar36);
        }
        else {
          p_Var44 = (_Rb_tree_node_base *)((long)ppIVar35 + 0x80);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (ppIVar35,p_Var44);
          for (; p_Var44 != (_Rb_tree_node_base *)ppIVar36;
              p_Var44 = (_Rb_tree_node_base *)&p_Var44->_M_parent) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (p_Var44);
          }
        }
      }
      local_7b8._M_node =
           (_Base_ptr)
           local_5f0.
           super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (local_5f0.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_5f0.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var44 = (_Rb_tree_node_base *)
                  local_5f0.
                  super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          while( true ) {
            paVar41 = *(aiNode **)(*(long *)p_Var44 + 0x68);
            local_598 = *(aiNode **)(*(long *)p_Var44 + 0x70);
            if (paVar41 == local_598) break;
            local_718 = (_Rb_tree_node_base *)((ulong)local_718 & 0xffffffff00000000);
            local_790 = p_Var44;
            do {
              local_7a8 = paVar41;
              pIVar55 = (IFC *)Assimp::STEP::LazyObject::
                               To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                         ((LazyObject *)*(aiString **)&paVar41->mName);
              plVar39 = (long *)__dynamic_cast(pIVar55 + *(long *)(*(long *)pIVar55 + -0x18),
                                               &Assimp::STEP::Object::typeinfo,
                                               &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo);
              if (plVar39 == (long *)0x0) {
                bVar75 = Assimp::IFC::ProcessRepresentationItem
                                   (pIVar55,(IfcRepresentationItem *)((ulong)local_5c8 & 0xffffffff)
                                    ,(uint)&local_4b8,
                                    (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)el,(ConversionData *)collect_openings);
                local_718 = (_Rb_tree_node_base *)
                            CONCAT44(local_718._4_4_,
                                     CONCAT31((int3)((ulong)local_718 >> 8),(byte)local_718 | bVar75
                                             ));
              }
              else {
                paVar41 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(paVar41);
                (paVar41->mName).length = 0xd;
                builtin_strncpy((paVar41->mName).data,"IfcMappedItem",0xe);
                local_708._0_8_ = (aiNode *)0x3ff0000000000000;
                p_Stack_6f0 = (_Rb_tree_node_base *)0x0;
                p_Stack_6e8 = (_Rb_tree_node_base *)0x0;
                local_708._8_8_ = 0.0;
                p_Stack_6f8 = (_Base_ptr)0x0;
                local_6e0 = 1.0;
                dStack_6c8 = 0.0;
                dStack_6c0 = 0.0;
                ppaStack_6d8 = (pointer)0x0;
                ppaStack_6d0 = (pointer)0x0;
                local_6b8 = 1.0;
                dStack_6a0 = 0.0;
                dStack_698 = 0.0;
                dStack_6b0 = 0.0;
                dStack_6a8 = 0.0;
                local_690 = 1.0;
                local_798 = paVar41;
                op_00 = Assimp::STEP::LazyObject::
                        To<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>
                                  ((LazyObject *)plVar39[5]);
                Assimp::IFC::ConvertTransformOperator((IfcMatrix4 *)local_708,op_00);
                local_688 = ZEXT816(0x3ff0000000000000);
                auStack_678 = ZEXT816(0);
                auStack_668 = (undefined1  [8])0x0;
                local_660 = (aiScene *)0x3ff0000000000000;
                local_648 = ZEXT816(0);
                local_658 = ZEXT816(0);
                local_638 = ZEXT816(0x3ff0000000000000);
                auStack_628 = ZEXT816(0);
                auStack_618 = (undefined1  [8])0x0;
                local_610 = 1.0;
                pIVar56 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar39[4]);
                Assimp::IFC::ConvertAxisPlacement
                          ((IfcMatrix4 *)local_688,
                           *(IfcAxis2Placement **)
                            &(pIVar56->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>)
                             .field_0x10,(ConversionData *)el);
                paVar28 = local_660;
                auVar27 = auStack_668;
                uVar58 = local_688._0_8_;
                uVar24 = local_688._8_8_;
                uVar31 = local_648._0_8_;
                uVar32 = local_648._8_8_;
                dVar4 = (double)auStack_628._8_8_ * (double)p_Stack_6f0 +
                        (double)local_648._8_8_ * (double)p_Stack_6f8 +
                        (double)local_688._8_8_ * (double)local_708._0_8_ +
                        (double)local_708._8_8_ * (double)local_660;
                local_688._8_4_ = SUB84(dVar4,0);
                local_688._0_8_ =
                     (double)auStack_628._0_8_ * (double)p_Stack_6f0 +
                     (double)local_648._0_8_ * (double)p_Stack_6f8 +
                     (double)local_688._0_8_ * (double)local_708._0_8_ +
                     (double)local_708._8_8_ * (double)auStack_668;
                local_688._12_4_ = (int)((ulong)dVar4 >> 0x20);
                uVar25 = auStack_678._0_8_;
                uVar26 = auStack_678._8_8_;
                uVar29 = local_658._0_8_;
                uVar30 = local_658._8_8_;
                uVar33 = local_638._0_8_;
                uVar34 = local_638._8_8_;
                dVar4 = (double)p_Stack_6f0 * local_610 +
                        (double)p_Stack_6f8 * (double)local_638._8_8_ +
                        (double)local_708._0_8_ * (double)auStack_678._8_8_ +
                        (double)local_708._8_8_ * (double)local_658._8_8_;
                auStack_678._8_4_ = SUB84(dVar4,0);
                auStack_678._0_8_ =
                     (double)p_Stack_6f0 * (double)auStack_618 +
                     (double)p_Stack_6f8 * (double)local_638._0_8_ +
                     (double)local_708._0_8_ * (double)auStack_678._0_8_ +
                     (double)local_708._8_8_ * (double)local_658._0_8_;
                auStack_678._12_4_ = (int)((ulong)dVar4 >> 0x20);
                dVar4 = (double)auStack_628._8_8_ * (double)ppaStack_6d0 +
                        (double)local_648._8_8_ * (double)ppaStack_6d8 +
                        (double)uVar24 * (double)p_Stack_6e8 + local_6e0 * (double)local_660;
                unique0x10002723 = SUB84(dVar4,0);
                auStack_668 = (undefined1  [8])
                              ((double)auStack_628._0_8_ * (double)ppaStack_6d0 +
                              (double)local_648._0_8_ * (double)ppaStack_6d8 +
                              (double)uVar58 * (double)p_Stack_6e8 + local_6e0 * (double)auStack_668
                              );
                unique0x10002727 = (int)((ulong)dVar4 >> 0x20);
                dVar4 = (double)ppaStack_6d0 * local_610 +
                        (double)ppaStack_6d8 * (double)local_638._8_8_ +
                        (double)p_Stack_6e8 * (double)uVar26 + local_6e0 * (double)local_658._8_8_;
                local_658._8_4_ = SUB84(dVar4,0);
                local_658._0_8_ =
                     (double)ppaStack_6d0 * (double)auStack_618 +
                     (double)ppaStack_6d8 * (double)local_638._0_8_ +
                     (double)p_Stack_6e8 * (double)uVar25 + local_6e0 * (double)local_658._0_8_;
                local_658._12_4_ = (int)((ulong)dVar4 >> 0x20);
                dVar4 = (double)auStack_628._8_8_ * dStack_6b0 +
                        (double)local_648._8_8_ * local_6b8 +
                        (double)uVar24 * dStack_6c8 + dStack_6c0 * (double)paVar28;
                local_648._8_4_ = SUB84(dVar4,0);
                local_648._0_8_ =
                     (double)auStack_628._0_8_ * dStack_6b0 +
                     (double)local_648._0_8_ * local_6b8 +
                     (double)uVar58 * dStack_6c8 + dStack_6c0 * (double)auVar27;
                local_648._12_4_ = (int)((ulong)dVar4 >> 0x20);
                dVar4 = dStack_6b0 * local_610 +
                        local_6b8 * (double)local_638._8_8_ +
                        dStack_6c8 * (double)uVar26 + dStack_6c0 * (double)uVar30;
                local_638._8_4_ = SUB84(dVar4,0);
                local_638._0_8_ =
                     dStack_6b0 * (double)auStack_618 +
                     local_6b8 * (double)local_638._0_8_ +
                     dStack_6c8 * (double)uVar25 + dStack_6c0 * (double)uVar29;
                local_638._12_4_ = (int)((ulong)dVar4 >> 0x20);
                dVar4 = (double)auStack_628._8_8_ * local_690 +
                        (double)uVar32 * dStack_698 +
                        (double)uVar24 * dStack_6a8 + (double)paVar28 * dStack_6a0;
                auStack_628._8_4_ = SUB84(dVar4,0);
                auStack_628._0_8_ =
                     (double)auStack_628._0_8_ * local_690 +
                     (double)uVar31 * dStack_698 +
                     (double)uVar58 * dStack_6a8 + (double)auVar27 * dStack_6a0;
                auStack_628._12_4_ = (int)((ulong)dVar4 >> 0x20);
                dVar4 = local_690 * local_610 +
                        dStack_698 * (double)uVar34 +
                        dStack_6a8 * (double)uVar26 + dStack_6a0 * (double)uVar30;
                unique0x100015e3 = SUB84(dVar4,0);
                auStack_618 = (undefined1  [8])
                              (local_690 * (double)auStack_618 +
                              dStack_698 * (double)uVar33 +
                              dStack_6a8 * (double)uVar25 + dStack_6a0 * (double)uVar29);
                unique0x100015e7 = (int)((ulong)dVar4 >> 0x20);
                local_748._8_8_ = local_748._8_8_ & 0xffffffff00000000;
                local_748._16_8_ = (_Base_ptr)0x0;
                p_Stack_730 = (_Base_ptr)(local_748 + 8);
                local_720 = 0;
                plVar2 = *(long **)&el[1].super_IfcObject.field_0x38;
                lVar47 = 0;
                if (plVar2 != (long *)0x0) {
                  lVar47 = (plVar2[1] - *plVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
                }
                local_728 = p_Stack_730;
                if (*(long *)&el[1].super_IfcObject.field_0x30 != 0) {
                  pdVar71 = (double *)local_688;
                  paVar50 = (aiMatrix4x4t<double> *)local_438;
                  for (lVar38 = 0x10; lVar38 != 0; lVar38 = lVar38 + -1) {
                    paVar50->a1 = *pdVar71;
                    pdVar71 = pdVar71 + (ulong)bVar76 * -2 + 1;
                    paVar50 = (aiMatrix4x4t<double> *)((long)paVar50 + (ulong)bVar76 * -0x10 + 8);
                  }
                  aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_438);
                  puVar68 = *(undefined8 **)&el[1].super_IfcObject.field_0x30;
                  pTVar70 = (TempOpening *)puVar68[1];
                  for (pTVar69 = (TempOpening *)*puVar68; pTVar69 != pTVar70; pTVar69 = pTVar69 + 1)
                  {
                    Assimp::IFC::TempOpening::Transform(pTVar69,(aiMatrix4x4t<double> *)local_438);
                  }
                }
                local_5d8._0_8_ = lVar47;
                uVar66 = Assimp::IFC::ProcessMaterials
                                   (*(uint64_t *)((long)plVar39 + *(long *)(*plVar39 + -0x18) + 8),
                                    (uint)local_5c8,(ConversionData *)el,false);
                pIVar56 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar39[4]);
                pIVar57 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentation>
                                    (*(LazyObject **)
                                      &(pIVar56->
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                       ).field_0x20);
                pLVar74 = (pIVar57->Items).
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pLVar3 = (pIVar57->Items).
                         super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                         .
                         super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (pLVar74 == pLVar3) {
LAB_004aa606:
                  paVar41 = local_798;
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_748);
                  if (paVar41 != (aiNode *)0x0) {
                    aiNode::~aiNode(paVar41);
                    operator_delete(paVar41);
                  }
                }
                else {
                  uVar58 = 0;
                  do {
                    local_768 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                 *)CONCAT44(local_768._4_4_,(int)uVar58);
                    while( true ) {
                      pIVar55 = (IFC *)Assimp::STEP::LazyObject::
                                       To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                                 (pLVar74->obj);
                      bVar75 = Assimp::IFC::ProcessRepresentationItem
                                         (pIVar55,(IfcRepresentationItem *)(ulong)uVar66,
                                          (uint)local_748,
                                          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                           *)el,(ConversionData *)collect_openings);
                      if (bVar75) break;
                      std::__cxx11::string::string
                                ((string *)local_488,
                                 *(char **)(pIVar55 + *(long *)(*(long *)pIVar55 + -0x18) + 0x10),
                                 &local_7a9);
                      collect_openings =
                           (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                            *)0x1f;
                      plVar39 = (long *)std::__cxx11::string::replace
                                                  ((ulong)local_488,0,(char *)0x0,0x76c999);
                      local_5b8 = &local_5a8;
                      ppaVar62 = (aiMaterial **)(plVar39 + 2);
                      if ((aiMaterial **)*plVar39 == ppaVar62) {
                        local_5a8 = *ppaVar62;
                        lStack_5a0 = plVar39[3];
                      }
                      else {
                        local_5a8 = *ppaVar62;
                        local_5b8 = (aiMaterial **)*plVar39;
                      }
                      local_5b0 = (pointer)plVar39[1];
                      *plVar39 = (long)ppaVar62;
                      plVar39[1] = 0;
                      *(undefined1 *)(plVar39 + 2) = 0;
                      plVar39 = (long *)std::__cxx11::string::append((char *)&local_5b8);
                      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
                      psVar63 = (size_type *)(plVar39 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar39 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar63) {
                        local_788.field_2._M_allocated_capacity = *psVar63;
                        local_788.field_2._8_8_ = plVar39[3];
                      }
                      else {
                        local_788.field_2._M_allocated_capacity = *psVar63;
                        local_788._M_dataplus._M_p = (pointer)*plVar39;
                      }
                      local_788._M_string_length = plVar39[1];
                      *plVar39 = (long)psVar63;
                      plVar39[1] = 0;
                      *(undefined1 *)(plVar39 + 2) = 0;
                      Assimp::Formatter::
                      basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_438,&local_788);
                      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_438);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                      std::ios_base::~ios_base((ios_base *)auStack_3c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_788._M_dataplus._M_p != &local_788.field_2) {
                        operator_delete(local_788._M_dataplus._M_p);
                      }
                      if (local_5b8 != &local_5a8) {
                        operator_delete(local_5b8);
                      }
                      if (local_488[0] != local_478) {
                        operator_delete(local_488[0]);
                      }
                      pLVar74 = pLVar74 + 1;
                      if (pLVar74 == pLVar3) {
                        if (((ulong)local_768 & 1) != 0) goto LAB_004aa359;
                        goto LAB_004aa606;
                      }
                    }
                    pLVar74 = pLVar74 + 1;
                    uVar58 = CONCAT71(extraout_var,1);
                  } while (pLVar74 != pLVar3);
LAB_004aa359:
                  Assimp::IFC::AssignAddedMeshes
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_748,local_798,(ConversionData *)el);
                  plVar39 = *(long **)&el[1].super_IfcObject.field_0x38;
                  if (plVar39 != (long *)0x0) {
                    lVar47 = (plVar39[1] - *plVar39 >> 3) * 0x2e8ba2e8ba2e8ba3 - local_5d8._0_8_;
                    if (lVar47 != 0) {
                      lVar38 = local_5d8._0_8_ * 0x58;
                      do {
                        Assimp::IFC::TempOpening::Transform
                                  ((TempOpening *)
                                   (**(long **)&el[1].super_IfcObject.field_0x38 + lVar38),
                                   (IfcMatrix4 *)local_688);
                        lVar38 = lVar38 + 0x58;
                        lVar47 = lVar47 + -1;
                      } while (lVar47 != 0);
                    }
                  }
                  local_438._0_8_ = local_798;
                  fVar5 = (this_01->mTransformation).a1;
                  fVar6 = (this_01->mTransformation).a2;
                  fVar7 = (this_01->mTransformation).a3;
                  fVar8 = (this_01->mTransformation).a4;
                  fVar9 = (this_01->mTransformation).b1;
                  fVar10 = (this_01->mTransformation).b2;
                  fVar11 = (this_01->mTransformation).b3;
                  fVar77 = (float)(double)auStack_678._0_8_;
                  fVar79 = (float)(double)auStack_678._8_8_;
                  fVar12 = (this_01->mTransformation).b4;
                  fVar91 = (float)(double)local_688._0_8_;
                  fVar92 = (float)(double)local_688._8_8_;
                  fVar13 = (this_01->mTransformation).c1;
                  fVar81 = (float)(double)local_658._0_8_;
                  fVar83 = (float)(double)local_658._8_8_;
                  fVar14 = (this_01->mTransformation).c2;
                  fVar85 = (float)(double)auStack_668;
                  fVar86 = (float)(double)local_660;
                  fVar15 = (this_01->mTransformation).c3;
                  fVar87 = (float)(double)local_638._0_8_;
                  fVar89 = (float)(double)local_638._8_8_;
                  local_768 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)CONCAT44(fVar92,fVar91);
                  uStack_760 = (double)CONCAT44(fVar79,fVar77);
                  fVar78 = (float)(double)local_648._0_8_;
                  fVar80 = (float)(double)local_648._8_8_;
                  fVar82 = (float)(double)auStack_618;
                  fVar84 = (float)local_610;
                  fVar88 = (float)(double)auStack_628._0_8_;
                  fVar90 = (float)(double)auStack_628._8_8_;
                  fVar16 = (this_01->mTransformation).c4;
                  fVar17 = (this_01->mTransformation).d1;
                  fVar18 = (this_01->mTransformation).d2;
                  fVar19 = (this_01->mTransformation).d3;
                  fVar20 = (this_01->mTransformation).d4;
                  (local_798->mTransformation).a1 =
                       fVar8 * fVar88 + fVar7 * fVar78 + fVar5 * fVar91 + fVar6 * fVar85;
                  (local_798->mTransformation).a2 =
                       fVar8 * fVar90 + fVar7 * fVar80 + fVar5 * fVar92 + fVar6 * fVar86;
                  (local_798->mTransformation).a3 =
                       fVar8 * fVar82 + fVar7 * fVar87 + fVar5 * fVar77 + fVar6 * fVar81;
                  (local_798->mTransformation).a4 =
                       fVar8 * fVar84 + fVar7 * fVar89 + fVar5 * fVar79 + fVar6 * fVar83;
                  (local_798->mTransformation).b1 =
                       fVar12 * fVar88 + fVar11 * fVar78 + fVar9 * fVar91 + fVar10 * fVar85;
                  (local_798->mTransformation).b2 =
                       fVar12 * fVar90 + fVar11 * fVar80 + fVar9 * fVar92 + fVar10 * fVar86;
                  (local_798->mTransformation).b3 =
                       fVar12 * fVar82 + fVar11 * fVar87 + fVar9 * fVar77 + fVar10 * fVar81;
                  (local_798->mTransformation).b4 =
                       fVar12 * fVar84 + fVar11 * fVar89 + fVar9 * fVar79 + fVar10 * fVar83;
                  (local_798->mTransformation).c1 =
                       fVar16 * fVar88 + fVar15 * fVar78 + fVar13 * fVar91 + fVar14 * fVar85;
                  (local_798->mTransformation).c2 =
                       fVar16 * fVar90 + fVar15 * fVar80 + fVar13 * fVar92 + fVar14 * fVar86;
                  (local_798->mTransformation).c3 =
                       fVar16 * fVar82 + fVar15 * fVar87 + fVar13 * fVar77 + fVar14 * fVar81;
                  (local_798->mTransformation).c4 =
                       fVar16 * fVar84 + fVar15 * fVar89 + fVar13 * fVar79 + fVar14 * fVar83;
                  (local_798->mTransformation).d1 =
                       fVar20 * fVar88 + fVar19 * fVar78 + fVar17 * fVar91 + fVar18 * fVar85;
                  (local_798->mTransformation).d2 =
                       fVar20 * fVar90 + fVar19 * fVar80 + fVar17 * fVar92 + fVar18 * fVar86;
                  (local_798->mTransformation).d3 =
                       fVar20 * fVar82 + fVar19 * fVar87 + fVar17 * fVar77 + fVar18 * fVar81;
                  (local_798->mTransformation).d4 =
                       fVar20 * fVar84 + fVar19 * fVar89 + fVar17 * fVar79 + fVar18 * fVar83;
                  local_798 = (aiNode *)0x0;
                  if (iStack_7d0._M_current == local_7c8) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_7d8,iStack_7d0,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_7d0._M_current = (aiNode *)local_438._0_8_;
                    iStack_7d0._M_current = iStack_7d0._M_current + 1;
                  }
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_748);
                  local_718 = (_Rb_tree_node_base *)
                              CONCAT44(local_718._4_4_,
                                       (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
                }
              }
              paVar41 = (aiNode *)((local_7a8->mName).data + 4);
            } while (paVar41 != local_598);
            p_Var44 = (_Rb_tree_node_base *)&local_790->_M_parent;
            if (((ulong)local_718 & 1) != 0 || p_Var44 == local_7b8._M_node) goto LAB_004aa6b8;
          }
          p_Var44 = (_Rb_tree_node_base *)&p_Var44->_M_parent;
        } while (p_Var44 != local_7b8._M_node);
      }
LAB_004aa6b8:
      Assimp::IFC::AssignAddedMeshes
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &local_4b8,this_01,(ConversionData *)el);
      if ((_Rb_tree_node_base *)
          local_5f0.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (_Rb_tree_node_base *)0x0) {
        operator_delete(local_5f0.
                        super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_4b8);
    }
    *(undefined8 *)&el[1].super_IfcObject.field_0x30 = 0;
    *(undefined8 *)&el[1].super_IfcObject.field_0x38 = 0;
  }
  iVar23._M_current = iStack_7d0._M_current;
  ppaVar52 = local_7d8;
  uVar72 = (long)iStack_7d0._M_current - (long)local_7d8;
  if (uVar72 != 0) {
    __n_00 = 0xffffffffffffffff;
    if (-1 < (long)uVar72) {
      __n_00 = uVar72;
    }
    __s_00 = (aiNode **)operator_new__(__n_00);
    memset(__s_00,0,__n_00);
    this_01->mChildren = __s_00;
    do {
      paVar41 = *ppaVar52;
      uVar66 = this_01->mNumChildren;
      this_01->mNumChildren = uVar66 + 1;
      this_01->mChildren[uVar66] = paVar41;
      paVar41->mParent = this_01;
      ppaVar52 = ppaVar52 + 1;
    } while (ppaVar52 != iVar23._M_current);
  }
  p_Var59 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
  if (p_Var59 != (_Base_ptr)0x0) {
    uVar72 = *(ulong *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    __position._M_node = (_Base_ptr)&el[1].super_IfcObject.field_0x48;
    p_Var64 = __position._M_node;
    p_Var45 = p_Var59;
    do {
      if (*(ulong *)(p_Var45 + 1) >= uVar72) {
        p_Var64 = p_Var45;
      }
      p_Var45 = (&p_Var45->_M_left)[*(ulong *)(p_Var45 + 1) < uVar72];
    } while (p_Var45 != (_Base_ptr)0x0);
    if ((p_Var64 != __position._M_node) &&
       (p_Var65 = __position._M_node, *(ulong *)(p_Var64 + 1) <= uVar72)) {
      do {
        if (*(ulong *)(p_Var59 + 1) >= uVar72) {
          p_Var65 = p_Var59;
        }
        p_Var59 = (&p_Var59->_M_left)[*(ulong *)(p_Var59 + 1) < uVar72];
      } while (p_Var59 != (_Base_ptr)0x0);
      if ((p_Var65 != __position._M_node) && (*(ulong *)(p_Var65 + 1) <= uVar72)) {
        __position._M_node = p_Var65;
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::erase_abi_cxx11_(local_600,__position);
      if (local_7d8 != (aiNode **)0x0) {
        operator_delete(local_7d8);
      }
      std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
                (&local_588);
      return this_01;
    }
  }
  __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCLoader.cpp"
                ,0x365,
                "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
               );
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}